

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void __thiscall
cpptrace::detail::
optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::swap
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *this,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                 *other)

{
  bool bVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
  *this_00;
  
  if (this->holds_value == true) {
    if (other->holds_value != false) {
      std::__cxx11::string::swap((string *)this);
      goto LAB_0013ac5f;
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)other,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    this_00 = this;
  }
  else {
    if (other->holds_value == false) goto LAB_0013ac5f;
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)other);
    this_00 = other;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0013ac5f:
  bVar1 = this->holds_value;
  this->holds_value = other->holds_value;
  other->holds_value = bVar1;
  return;
}

Assistant:

void swap(optional& other) noexcept {
            if(holds_value && other.holds_value) {
                std::swap(uvalue, other.uvalue);
            } else if(holds_value && !other.holds_value) {
                new (&other.uvalue) T(std::move(uvalue));
                uvalue.~T();
            } else if(!holds_value && other.holds_value) {
                new (static_cast<void*>(std::addressof(uvalue))) T(std::move(other.uvalue));
                other.uvalue.~T();
            }
            std::swap(holds_value, other.holds_value);
        }